

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O0

int main(void)

{
  initializer_list<long> __l;
  bool bVar1;
  alns_t *in_RCX;
  anon_class_16_2_d6ff961e_for_gen gen_fn;
  allocator<long> local_ad9;
  long local_ad8 [3];
  iterator local_ac0;
  size_type_conflict local_ab8;
  vector<long,_std::allocator<long>_> local_ab0;
  vector<long,_std::allocator<long>_> *local_a98;
  for_each<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:389:19)>
  local_a90;
  undefined8 local_a88;
  undefined1 *local_a80;
  seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>
  local_a78;
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  local_9d0;
  undefined1 auStack_628 [8];
  vector<long,_std::allocator<long>_> kept_ids;
  value_type local_608;
  int local_588 [2];
  value_type local_580;
  int local_500 [2];
  value_type local_4f8;
  int local_478 [2];
  value_type local_470;
  int local_3f0 [2];
  value_type local_3e8;
  int local_368 [2];
  value_type local_360;
  int local_2e0 [2];
  value_type local_2d8;
  int local_258 [2];
  value_type local_250;
  int local_1d0 [2];
  value_type local_1c8;
  int local_148 [2];
  value_type local_140;
  int local_c0 [5];
  int local_ac;
  value_type local_a8;
  undefined1 auStack_28 [8];
  alns_t alns;
  
  alns.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  auStack_28 = (undefined1  [8])0x0;
  alns.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  alns.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28);
  local_a8.aln_id = 0x65;
  local_a8.gene_id = 2;
  local_ac = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_a8.mrna_id,(char (*) [10])"NM_000001",&local_ac);
  local_c0[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_a8.chr_id,(char (*) [10])"NC_000001",local_c0);
  local_a8.chr_start = 1000000;
  local_a8.chr_stop = 0xf4628;
  local_a8.chr_cds_start_pos = 0x18704;
  local_a8.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_a8);
  example::aln_t::~aln_t(&local_a8);
  local_140.aln_id = 0x66;
  local_140.gene_id = 2;
  local_148[1] = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_140.mrna_id,(char (*) [10])"NM_000001",local_148 + 1)
  ;
  local_148[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_140.chr_id,(char (*) [10])"NC_000001",local_148);
  local_140.chr_start = 1000000;
  local_140.chr_stop = 0xf4628;
  local_140.chr_cds_start_pos = 0x18704;
  local_140.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_140);
  example::aln_t::~aln_t(&local_140);
  local_1c8.aln_id = 0x67;
  local_1c8.gene_id = 2;
  local_1d0[1] = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_1c8.mrna_id,(char (*) [10])"NM_000001",local_1d0 + 1)
  ;
  local_1d0[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_1c8.chr_id,(char (*) [10])"NC_000001",local_1d0);
  local_1c8.chr_start = 0xf4241;
  local_1c8.chr_stop = 0xf4628;
  local_1c8.chr_cds_start_pos = 0x18704;
  local_1c8.score = 0x32;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_1c8);
  example::aln_t::~aln_t(&local_1c8);
  local_250.aln_id = 0x68;
  local_250.gene_id = 2;
  local_258[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_250.mrna_id,(char (*) [10])"NM_000001",local_258 + 1)
  ;
  local_258[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_250.chr_id,(char (*) [10])"NC_000001",local_258);
  local_250.chr_start = 1000000;
  local_250.chr_stop = 0xf4628;
  local_250.chr_cds_start_pos = 0x18704;
  local_250.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_250);
  example::aln_t::~aln_t(&local_250);
  local_2d8.aln_id = 0xc9;
  local_2d8.gene_id = 2;
  local_2e0[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_2d8.mrna_id,(char (*) [10])"NM_000002",local_2e0 + 1)
  ;
  local_2e0[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_2d8.chr_id,(char (*) [10])"NC_000001",local_2e0);
  local_2d8.chr_start = 1000000;
  local_2d8.chr_stop = 0xf4628;
  local_2d8.chr_cds_start_pos = 0;
  local_2d8.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_2d8);
  example::aln_t::~aln_t(&local_2d8);
  local_360.aln_id = 0x12d;
  local_360.gene_id = 2;
  local_368[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_360.mrna_id,(char (*) [10])"NM_000003",local_368 + 1)
  ;
  local_368[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_360.chr_id,(char (*) [10])"NC_000001",local_368);
  local_360.chr_start = 1000000;
  local_360.chr_stop = 0xf4628;
  local_360.chr_cds_start_pos = 0;
  local_360.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_360);
  example::aln_t::~aln_t(&local_360);
  local_3e8.aln_id = 0x191;
  local_3e8.gene_id = 2;
  local_3f0[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_3e8.mrna_id,(char (*) [10])"NM_000004",local_3f0 + 1)
  ;
  local_3f0[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_3e8.chr_id,(char (*) [10])"NC_000001",local_3f0);
  local_3e8.chr_start = 1000000;
  local_3e8.chr_stop = 0xf4628;
  local_3e8.chr_cds_start_pos = 0;
  local_3e8.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_3e8);
  example::aln_t::~aln_t(&local_3e8);
  local_470.aln_id = 0x1f5;
  local_470.gene_id = 2;
  local_478[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_470.mrna_id,(char (*) [10])"NM_000005",local_478 + 1)
  ;
  local_478[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_470.chr_id,(char (*) [10])"NC_000001",local_478);
  local_470.chr_start = 1000000;
  local_470.chr_stop = 0xf4628;
  local_470.chr_cds_start_pos = 0x18704;
  local_470.score = 0x6e;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_470);
  example::aln_t::~aln_t(&local_470);
  local_4f8.aln_id = 0x321;
  local_4f8.gene_id = 2;
  local_500[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_4f8.mrna_id,(char (*) [10])"NM_000008",local_500 + 1)
  ;
  local_500[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_4f8.chr_id,(char (*) [10])"NC_000001",local_500);
  local_4f8.chr_start = 1000000;
  local_4f8.chr_stop = 0xf4628;
  local_4f8.chr_cds_start_pos = 0x18768;
  local_4f8.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_4f8);
  example::aln_t::~aln_t(&local_4f8);
  local_580.aln_id = 0x259;
  local_580.gene_id = 3;
  local_588[1] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_580.mrna_id,(char (*) [10])"NM_000005",local_588 + 1)
  ;
  local_588[0] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>(&local_580.chr_id,(char (*) [10])"NC_000001",local_588);
  local_580.chr_start = 1000000;
  local_580.chr_stop = 0xf4628;
  local_580.chr_cds_start_pos = 0x18704;
  local_580.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_580);
  example::aln_t::~aln_t(&local_580);
  local_608.aln_id = 0x2bd;
  local_608.gene_id = 3;
  kept_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            (&local_608.mrna_id,(char (*) [10])"NM_000007",
             (int *)((long)&kept_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  kept_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_int,_true>
            (&local_608.chr_id,(char (*) [10])"NT_000001",
             (int *)&kept_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  local_608.chr_start = 1000000;
  local_608.chr_stop = 0xf4628;
  local_608.chr_cds_start_pos = 0x18704;
  local_608.score = 100;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::push_back
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28,&local_608);
  example::aln_t::~aln_t(&local_608);
  auStack_628 = (undefined1  [8])0x0;
  kept_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  kept_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)auStack_628);
  local_a88 = 0;
  local_a80 = auStack_28;
  gen_fn.alns = in_RCX;
  gen_fn.i = (unsigned_long)local_a80;
  rangeless::fn::seq<main::__0>(&local_a78,(fn *)0x0,gen_fn);
  rangeless::fn::operators::operator%
            (&local_9d0,&local_a78,(anon_class_1_0_00000001 *)&example::aln_filter);
  local_a98 = (vector<long,_std::allocator<long>_> *)auStack_628;
  local_a90 = rangeless::fn::for_each<main::__1>((anon_class_8_1_f78d7955_for_fn)local_a98);
  rangeless::fn::operators::operator%<_dd42fdd1_>(&local_9d0,&local_a90);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_(*)(std::vector<example::aln_t,_std::allocator<example::aln_t>_>)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:331:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:197:23)>::gen<rangeless::fn::impl::sliding_window::gen<rangeless::fn::impl::append<rangeless::fn::impl::seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:185:29)>_>_>::gen<rangeless::fn::impl::seq<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:171:23)>::gen<rangeless::fn::impl::group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:309:20)>::gen<rangeless::fn::impl::group_adjacent_by<std::_Mem_fn<int_example::aln_t::*>,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  ::~seq(&local_9d0);
  rangeless::fn::impl::
  seq<rangeless::fn::impl::catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>_>
  ::~seq(&local_a78);
  local_ad8[0] = 0x1f5;
  local_ad8[1] = 0x65;
  local_ad8[2] = 0x259;
  local_ac0 = local_ad8;
  local_ab8 = 3;
  std::allocator<long>::allocator(&local_ad9);
  __l._M_len = local_ab8;
  __l._M_array = local_ac0;
  std::vector<long,_std::allocator<long>_>::vector(&local_ab0,__l,&local_ad9);
  bVar1 = std::operator==((vector<long,_std::allocator<long>_> *)auStack_628,&local_ab0);
  if (!bVar1) {
    __assert_fail("(kept_ids == std::vector<int64_t>{{ 501, 101, 601 }} )",
                  "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp"
                  ,0x18b,"int main()");
  }
  std::vector<long,_std::allocator<long>_>::~vector(&local_ab0);
  std::allocator<long>::~allocator(&local_ad9);
  alns.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)auStack_628);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)auStack_28);
  return alns.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    using namespace example;
   
    alns_t alns{}; // normally these would come from a stream, but for the sake of example will yield from a vec.

    // GeneID:2
    alns.push_back(aln_t{ 101, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // keep.
    alns.push_back(aln_t{ 102, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // duplicate.
    alns.push_back(aln_t{ 103, 2, {"NM_000001", 2}, {"NC_000001", 1}, 1000001, 1001000, 100100, 50 }); // not top-scoring for this mrna.
    alns.push_back(aln_t{ 104, 2, {"NM_000001", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100}); // superceded mrna-version.
    alns.push_back(aln_t{ 201, 2, {"NM_000002", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 301, 2, {"NM_000003", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 401, 2, {"NM_000004", 1}, {"NC_000001", 1}, 1000000, 1001000, 0,      100}); // no valid-CDS.
    alns.push_back(aln_t{ 501, 2, {"NM_000005", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 110}); // keep.
    alns.push_back(aln_t{ 801, 2, {"NM_000008", 1}, {"NC_000001", 1}, 1000000, 1001000, 100200, 100}); // not most-supported-CDS.

    // GeneID:3
    alns.push_back(aln_t{ 601, 3, {"NM_000005", 1}, {"NC_000001", 1}, 1000000, 1001000, 100100, 100});  // keep.
    alns.push_back(aln_t{ 701, 3, {"NM_000007", 1}, {"NT_000001", 1}, 1000000, 1001000, 100100, 100});  // not on NC.
  
    namespace fn = rangeless::fn; 
    using fn::operators::operator%;

    std::vector<int64_t> kept_ids{};

    // we could just std::move(alns) instead of fn::seq(...) here,
    // but demonstrating that input can also be a lazy seq, e.g. deserializing from an istream.
    fn::seq([&, i = 0UL]() mutable -> aln_t
    {
        return i < alns.size() ? std::move(alns[i++]) : fn::end_seq();
    })

  % example::aln_filter

  % fn::for_each( [&](aln_t a)
    {
        std::cerr << a.gene_id << "\t" << a.aln_id << "\n";
        kept_ids.push_back(a.aln_id);
    });

    assert((kept_ids == std::vector<int64_t>{{ 501, 101, 601 }} ));
            
    return 0;
}